

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O0

int Imf_3_4::pixelTypeSize(PixelType type)

{
  ArgExc *this;
  int in_EDI;
  int size;
  int local_8;
  
  if (in_EDI == 0) {
    local_8 = Xdr::size<unsigned_int>();
  }
  else if (in_EDI == 1) {
    local_8 = Xdr::size<Imath_3_2::half>();
  }
  else {
    if (in_EDI != 2) {
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this,"Unknown pixel type.");
      __cxa_throw(this,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    local_8 = Xdr::size<float>();
  }
  return local_8;
}

Assistant:

int
pixelTypeSize (PixelType type)
{
    int size;

    switch (type)
    {
        case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

            size = Xdr::size<unsigned int> ();
            break;

        case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            size = Xdr::size<half> ();
            break;

        case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            size = Xdr::size<float> ();
            break;

        default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel type.");
    }

    return size;
}